

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpMessage<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  uint32_t uVar2;
  bool bVar3;
  ushort uVar4;
  char *pcVar5;
  void *pvVar6;
  MessageLite *pMVar7;
  TcParseTableBase *table_00;
  uint uVar8;
  int iVar9;
  Arena *arena;
  char *file;
  FieldEntry *pFVar10;
  long *plVar11;
  int iVar12;
  int iVar13;
  FieldEntry *entry;
  long v1;
  pair<const_char_*,_int> pVar14;
  ErrnoSaver local_40;
  
  entry = (FieldEntry *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  pFVar10 = entry;
  if (((ulong)entry & 3) != 0) {
LAB_0021c21a:
    AlignFail(pFVar10);
  }
  uVar1 = entry->type_card;
  uVar4 = uVar1 & 0x30;
  if (uVar4 == 0x20) {
    if ((uVar1 & 0x1c0) == 0x40) {
      pcVar5 = MpRepeatedMessageOrGroup<true,true>(msg,ptr,ctx,data,table,hasbits);
      return pcVar5;
    }
    if ((uVar1 & 0x1c0) == 0) {
      pcVar5 = MpRepeatedMessageOrGroup<true,false>(msg,ptr,ctx,data,table,hasbits);
      return pcVar5;
    }
LAB_0021bfbe:
    pcVar5 = (*table->fallback)(msg,ptr,ctx,(TcFieldData)data.field_0,table,hasbits);
    return pcVar5;
  }
  uVar8 = data.field_0._0_4_ & 7;
  if ((uVar1 & 0x1c0) == 0x40) {
    if (uVar8 != 3) goto LAB_0021bfbe;
  }
  else if (((uVar1 & 0x1c0) != 0) || (uVar8 != 2)) goto LAB_0021bfbe;
  if (uVar4 == 0x30) {
    bVar3 = ChangeOneof(table,entry,(uint)((ulong)data.field_0 >> 3) & 0x1fffffff,
                        (ParseContext *)(ulong)uVar8,msg);
  }
  else {
    if (uVar4 == 0x10) {
      pFVar10 = (FieldEntry *)
                ((long)&msg->_vptr_MessageLite + (ulong)((uint)entry->has_idx >> 5) * 4);
      if (((ulong)pFVar10 & 3) != 0) goto LAB_0021c21a;
      pFVar10->offset = pFVar10->offset | 1 << ((byte)entry->has_idx & 0x1f);
    }
    bVar3 = false;
  }
  pvVar6 = MaybeGetSplitBase(msg,true,table);
  if ((ulong)table->has_bits_offset != 0) {
    pFVar10 = (FieldEntry *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)pFVar10 & 3) != 0) goto LAB_0021c21a;
    pFVar10->offset = pFVar10->offset | (uint)hasbits;
  }
  plVar11 = (long *)((long)pvVar6 + (ulong)entry->offset);
  if (((ulong)plVar11 & 7) != 0) {
    AlignFail(plVar11);
  }
  table_00 = *(TcParseTableBase **)
              ((long)&table->has_bits_offset + (ulong)entry->aux_idx * 8 + (ulong)table->aux_offset)
  ;
  uVar4 = uVar1 >> 9 & 3;
  if (uVar4 != 2) {
    if ((uVar1 >> 9 & 3) == 0) {
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      pcVar5 = "tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr";
      iVar9 = 0x9c8;
      goto LAB_0021c2ca;
    }
    if (uVar4 != 1) {
      table_00 = *(TcParseTableBase **)table_00;
    }
    table_00 = MessageLite::GetTcParseTable((MessageLite *)table_00);
  }
  if ((bVar3 | *plVar11 == 0) == 1) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar7 = ClassData::New(table_00->class_data,arena);
    *plVar11 = (long)pMVar7;
  }
  if ((uVar1 & 0x1c0) == 0x40) {
    iVar9 = ctx->depth_;
    uVar8 = iVar9 - 1;
    ctx->depth_ = uVar8;
    if (iVar9 < 1) {
      return (char *)0x0;
    }
    iVar12 = ctx->group_depth_;
    iVar13 = (int)((long)iVar12 + 1);
    ctx->group_depth_ = iVar13;
    pcVar5 = ParseLoopPreserveNone((MessageLite *)*plVar11,ptr,ctx,table_00);
    if (pcVar5 == (char *)0x0) {
      iVar12 = ctx->group_depth_ + -1;
      iVar9 = ctx->depth_ + 1;
LAB_0021c1ee:
      ctx->group_depth_ = iVar12;
      ctx->depth_ = iVar9;
      uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      if (uVar2 == data.field_0._0_4_) {
        return pcVar5;
      }
      return (char *)0x0;
    }
    if (uVar8 == ctx->depth_) {
      if (iVar13 == ctx->group_depth_) goto LAB_0021c1ee;
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)iVar12 + 1,(long)ctx->group_depth_,"old_group_depth == group_depth_"
                         );
      iVar9 = 0x492;
    }
    else {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)uVar8,(long)ctx->depth_,"old_depth == depth_");
      iVar9 = 0x491;
    }
  }
  else {
    if (*ptr < '\0') {
      pVar14 = ReadSizeFallback(ptr,(uint)(byte)*ptr);
      pcVar5 = pVar14.first;
      if (pcVar5 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      pcVar5 = ptr + 1;
    }
    if (ctx->depth_ < 1) {
      return (char *)0x0;
    }
    EpsCopyInputStream::PushLimit
              ((EpsCopyInputStream *)&stack0xffffffffffffffc0,(char *)ctx,(int)pcVar5);
    v1 = (long)ctx->depth_ + -1;
    iVar12 = (int)v1;
    ctx->depth_ = iVar12;
    pcVar5 = ParseLoopPreserveNone((MessageLite *)*plVar11,pcVar5,ctx,table_00);
    iVar9 = ctx->depth_;
    if ((pcVar5 == (char *)0x0) || (iVar12 == iVar9)) {
      ctx->depth_ = iVar9 + 1;
      uVar8 = local_40.saved_errno_ + (ctx->super_EpsCopyInputStream).limit_;
      (ctx->super_EpsCopyInputStream).limit_ = uVar8;
      if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar8 >> 0x1f & uVar8);
      return pcVar5;
    }
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (v1,(long)iVar9,"old_depth == depth_");
    iVar9 = 0x481;
  }
  file = 
  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
  ;
LAB_0021c2ca:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&stack0xffffffffffffffc0,file,iVar9,pcVar5);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&stack0xffffffffffffffc0);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMessage(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing:
  if (card == field_layout::kFcRepeated) {
    const uint16_t rep = type_card & field_layout::kRepMask;
    switch (rep) {
      case field_layout::kRepMessage:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, false>(
            PROTOBUF_TC_PARAM_PASS);
      case field_layout::kRepGroup:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, true>(
            PROTOBUF_TC_PARAM_PASS);
      default:
        PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;
  const uint16_t rep = type_card & field_layout::kRepMask;
  const bool is_group = rep == field_layout::kRepGroup;

  // Validate wiretype:
  switch (rep) {
    case field_layout::kRepMessage:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
        goto fallback;
      }
      break;
    case field_layout::kRepGroup:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
        goto fallback;
      }
      break;
    default: {
    fallback:
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  SyncHasbits(msg, hasbits, table);
  MessageLite*& field = RefAt<MessageLite*>(base, entry.offset);

  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));
  if (need_init || field == nullptr) {
    field = NewMessage(inner_table, msg->GetArena());
  }
  const auto inner_loop = [&](const char* ptr) {
    return ParseLoopPreserveNone(field, ptr, ctx, inner_table);
  };
  return is_group ? ctx->ParseGroupInlined(ptr, decoded_tag, inner_loop)
                  : ctx->ParseLengthDelimitedInlined(ptr, inner_loop);
}